

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

char * copy_trunc(char *p,char *str,int maxl,int quote)

{
  size_t sVar1;
  char *end;
  int bs;
  int size;
  int quote_local;
  int maxl_local;
  char *str_local;
  char *p_local;
  
  end._4_4_ = 0;
  sVar1 = strlen(str);
  _quote_local = (byte *)str;
  str_local = p;
  if (quote != 0) {
    str_local = p + 1;
    *p = '\"';
  }
  while ((((end._4_4_ < maxl && ((*_quote_local & 0xe0) != 0)) &&
          (end._0_4_ = fl_utf8len(*_quote_local), 0 < (int)end)) &&
         (_quote_local + (int)end <= str + sVar1))) {
    while ((int)end != 0) {
      *str_local = *_quote_local;
      end._0_4_ = (int)end + -1;
      _quote_local = _quote_local + 1;
      str_local = str_local + 1;
    }
    end._4_4_ = end._4_4_ + 1;
  }
  if (*_quote_local != 0) {
    strcpy(str_local,"...");
    str_local = str_local + 3;
  }
  if (quote != 0) {
    *str_local = '\"';
    str_local = str_local + 1;
  }
  *str_local = '\0';
  return str_local;
}

Assistant:

static char *copy_trunc(char *p, const char *str, int maxl, int quote) {

  int size = 0;				// truncated string size in characters
  int bs;				// size of UTF-8 character in bytes
  const char *end = str + strlen(str);	// end of input string
  if (quote) *p++ = '"';		// opening quote
  while (size < maxl) {			// maximum <maxl> characters
    if (!(*str & (-32))) break;		// end of string (0 or control char)
    bs = fl_utf8len(*str);		// size of next character
    if (bs <= 0) break;			// some error - leave
    if (str + bs > end) break;		// UTF-8 sequence beyond end of string
    while (bs--) *p++ = *str++;		// copy that character into the buffer
    size++;				// count copied characters
  }
  if (*str) {				// string was truncated
    strcpy(p,"..."); p += 3;
  }
  if (quote) *p++ = '"';		// closing quote
  *p = 0;				// terminating null byte
  return p;
}